

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall FIX::double_conversion::Bignum::MultiplyByUInt32(Bignum *this,uint32_t factor)

{
  Vector<unsigned_int> *this_00;
  uint *puVar1;
  ulong uVar2;
  int index;
  int i;
  int index_00;
  
  if (factor != 1) {
    if (factor == 0) {
      Zero(this);
      return;
    }
    index = this->used_digits_;
    if (index != 0) {
      this_00 = &this->bigits_;
      uVar2 = 0;
      for (index_00 = 0; index_00 < index; index_00 = index_00 + 1) {
        puVar1 = Vector<unsigned_int>::operator[](this_00,index_00);
        uVar2 = (ulong)*puVar1 * (ulong)factor + uVar2;
        puVar1 = Vector<unsigned_int>::operator[](this_00,index_00);
        *puVar1 = (uint)uVar2 & 0xfffffff;
        uVar2 = uVar2 >> 0x1c;
        index = this->used_digits_;
      }
      for (; uVar2 != 0; uVar2 = uVar2 >> 0x1c) {
        if (0x7f < index) {
          abort();
        }
        puVar1 = Vector<unsigned_int>::operator[](this_00,index);
        *puVar1 = (uint)uVar2 & 0xfffffff;
        index = this->used_digits_ + 1;
        this->used_digits_ = index;
      }
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt32(uint32_t factor) {
  if (factor == 1) return;
  if (factor == 0) {
    Zero();
    return;
  }
  if (used_digits_ == 0) return;

  // The product of a bigit with the factor is of size kBigitSize + 32.
  // Assert that this number + 1 (for the carry) fits into double chunk.
  ASSERT(kDoubleChunkSize >= kBigitSize + 32 + 1);
  DoubleChunk carry = 0;
  for (int i = 0; i < used_digits_; ++i) {
    DoubleChunk product = static_cast<DoubleChunk>(factor) * bigits_[i] + carry;
    bigits_[i] = static_cast<Chunk>(product & kBigitMask);
    carry = (product >> kBigitSize);
  }
  while (carry != 0) {
    EnsureCapacity(used_digits_ + 1);
    bigits_[used_digits_] = carry & kBigitMask;
    used_digits_++;
    carry >>= kBigitSize;
  }
}